

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall FFlatVertexBuffer::BindVBO(FFlatVertexBuffer *this)

{
  GLenum GVar1;
  GLenum GVar2;
  _func_void_GLenum **pp_Var3;
  _func_void_GLenum **pp_Var4;
  GLenum GVar5;
  _func_void_GLenum **pp_Var6;
  
  (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
  if (gl.legacyMode == false) {
    GVar1 = 3;
    (*_ptrc_glVertexAttribPointer)(0,3,0x1406,'\0',0x14,(void *)0x0);
    GVar5 = 1;
    GVar2 = 2;
    (*_ptrc_glVertexAttribPointer)(1,2,0x1406,'\0',0x14,(void *)0xc);
    (*_ptrc_glEnableVertexAttribArray)(0);
    pp_Var3 = (_func_void_GLenum **)&_ptrc_glDisableVertexAttribArray;
    pp_Var4 = (_func_void_GLenum **)&_ptrc_glDisableVertexAttribArray;
    pp_Var6 = (_func_void_GLenum **)&_ptrc_glEnableVertexAttribArray;
  }
  else {
    (*_ptrc_glVertexPointer)(3,0x1406,0x14,this->map);
    (*_ptrc_glTexCoordPointer)(2,0x1406,0x14,&this->map->u);
    GVar1 = 0x8076;
    pp_Var4 = &_ptrc_glDisableClientState;
    GVar2 = 0x8078;
    GVar5 = 0x8074;
    pp_Var6 = &_ptrc_glEnableClientState;
    pp_Var3 = &_ptrc_glEnableClientState;
  }
  (**pp_Var6)(GVar5);
  (**pp_Var3)(GVar2);
  (**pp_Var4)(GVar1);
  return;
}

Assistant:

void FFlatVertexBuffer::BindVBO()
{
	glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
	if (!gl.legacyMode)
	{
		glVertexAttribPointer(VATTR_VERTEX, 3, GL_FLOAT, false, sizeof(FFlatVertex), &VTO->x);
		glVertexAttribPointer(VATTR_TEXCOORD, 2, GL_FLOAT, false, sizeof(FFlatVertex), &VTO->u);
		glEnableVertexAttribArray(VATTR_VERTEX);
		glEnableVertexAttribArray(VATTR_TEXCOORD);
		glDisableVertexAttribArray(VATTR_COLOR);
		glDisableVertexAttribArray(VATTR_VERTEX2);
	}
	else
	{
		glVertexPointer(3, GL_FLOAT, sizeof(FFlatVertex), &map->x);
		glTexCoordPointer(2, GL_FLOAT, sizeof(FFlatVertex), &map->u);
		glEnableClientState(GL_VERTEX_ARRAY);
		glEnableClientState(GL_TEXTURE_COORD_ARRAY);
		glDisableClientState(GL_COLOR_ARRAY);
	}
}